

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O1

void __thiscall vector<NodeList<Node>_>::vector(vector<NodeList<Node>_> *this)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  
  puVar1 = (undefined8 *)operator_new__(0x20);
  *puVar1 = 1;
  puVar2 = (undefined8 *)operator_new__(8);
  *puVar2 = 0;
  puVar1[1] = puVar2;
  puVar1[2] = 0x100000000;
  *(undefined4 *)(puVar1 + 3) = 0;
  this->vect = (NodeList<Node> *)(puVar1 + 1);
  this->_size = 0;
  this->_capacity = 1;
  return;
}

Assistant:

vector() {
        vect = new T[1]();
        _size = 0;
        _capacity = 1;
    }